

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serial.cpp
# Opt level: O3

void __thiscall create::Serial::notifyDataReady(Serial *this)

{
  int iVar1;
  
  Data::validateAll((this->data).super___shared_ptr<create::Data,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                   );
  iVar1 = pthread_mutex_lock((pthread_mutex_t *)&this->dataReadyMut);
  if (iVar1 != 0) {
    std::__throw_system_error(iVar1);
  }
  if (this->dataReady == false) {
    this->dataReady = true;
    std::condition_variable::notify_one();
  }
  pthread_mutex_unlock((pthread_mutex_t *)&this->dataReadyMut);
  if ((this->callback).super__Function_base._M_manager != (_Manager_type)0x0) {
    (*(this->callback)._M_invoker)((_Any_data *)&this->callback);
    return;
  }
  return;
}

Assistant:

void Serial::notifyDataReady() {
    // Validate all packets
    data->validateAll();

    // Notify first data packets ready
    {
      std::lock_guard<std::mutex> lock(dataReadyMut);
      if (!dataReady) {
        dataReady = true;
        dataReadyCond.notify_one();
      }
    }
    // Callback to notify data is ready
    if (callback)
      callback();
  }